

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::getDoubleFromString(string *ustring,size_t *index)

{
  size_t sVar1;
  longdouble in_ST0;
  char *retloc;
  char *local_20;
  
  local_20 = (char *)0x0;
  strtold((ustring->_M_dataplus)._M_p,&local_20);
  if (local_20 == (char *)0x0) {
    *index = 0;
  }
  else {
    sVar1 = (long)local_20 - (long)(ustring->_M_dataplus)._M_p;
    *index = sVar1;
    if (sVar1 != 0) {
      if ((longdouble)1.79769313486232e+308 < in_ST0) {
        return INFINITY;
      }
      if (in_ST0 < (longdouble)-1.79769313486232e+308) {
        return -INFINITY;
      }
      if (ABS(in_ST0) < (longdouble)2.2250738585072014e-308) {
        return 0.0;
      }
      return (double)in_ST0;
    }
  }
  return NAN;
}

Assistant:

static double
    getDoubleFromString(const std::string& ustring, size_t* index) noexcept
{
    char* retloc = nullptr;
    auto vld = strtold(ustring.c_str(), &retloc);
    // LCOV_EXCL_START
    if (retloc == nullptr) {
        // to the best of my knowledge this should not happen but this is a
        // weird function sometimes with a lot of platform variations
        *index = 0;
        return constants::invalid_conversion;
    }
    // LCOV_EXCL_STOP
    *index = (retloc - ustring.c_str());
    // so if it converted anything then we can probably use that value if not
    // return NaN
    if (*index == 0) {
        return constants::invalid_conversion;
    }

    if (vld > static_cast<long double>(std::numeric_limits<double>::max())) {
        return constants::infinity;
    }
    if (vld < static_cast<long double>(-std::numeric_limits<double>::max())) {
        return -constants::infinity;
    }
    // floating point min gives you the smallest representable positive value
    if (std::fabs(vld) <
        static_cast<long double>(std::numeric_limits<double>::min())) {
        return 0.0;
    }
    return static_cast<double>(vld);
}